

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O0

S2Cap * __thiscall S2LatLngRect::GetCapBound(S2Cap *__return_storage_ptr__,S2LatLngRect *this)

{
  VType aVVar1 [2];
  VType aVVar2 [2];
  bool bVar3;
  double dVar4;
  double dVar5;
  S2LatLng SVar6;
  R2Point local_e8;
  S2Point local_d8;
  int local_bc;
  S1Angle SStack_b8;
  int k;
  R2Point local_b0;
  S2Point local_a0;
  byte local_85;
  double local_78;
  double lng_span;
  Vector3<double> local_68;
  undefined1 local_50 [8];
  S2Cap pole_cap;
  double pole_angle;
  double pole_z;
  S2LatLngRect *this_local;
  S2Cap *mid_cap;
  
  bVar3 = is_empty(this);
  if (bVar3) {
    S2Cap::Empty();
    return __return_storage_ptr__;
  }
  dVar4 = R1Interval::lo(&this->lat_);
  dVar5 = R1Interval::hi(&this->lat_);
  if (0.0 <= dVar4 + dVar5) {
    pole_angle = 1.0;
    dVar4 = R1Interval::lo(&this->lat_);
    pole_cap.radius_.length2_ = 1.5707963267948966 - dVar4;
  }
  else {
    pole_angle = -1.0;
    dVar4 = R1Interval::hi(&this->lat_);
    pole_cap.radius_.length2_ = dVar4 + 1.5707963267948966;
  }
  Vector3<double>::Vector3(&local_68,0.0,0.0,pole_angle);
  lng_span = (double)S1Angle::Radians(pole_cap.radius_.length2_);
  S2Cap::S2Cap((S2Cap *)local_50,&local_68,(S1Angle)lng_span);
  dVar4 = S1Interval::hi(&this->lng_);
  local_78 = S1Interval::lo(&this->lng_);
  local_78 = dVar4 - local_78;
  dVar4 = remainder(local_78,6.283185307179586);
  aVVar2[1] = local_e8.c_[1];
  aVVar2[0] = local_e8.c_[0];
  aVVar1[1] = local_b0.c_[1];
  aVVar1[0] = local_b0.c_[0];
  if ((0.0 <= dVar4) && (local_b0.c_ = aVVar1, local_e8.c_ = aVVar2, local_78 < 6.283185307179586))
  {
    local_85 = 0;
    local_b0.c_ = (VType  [2])GetCenter(this);
    S2LatLng::ToPoint(&local_a0,(S2LatLng *)&local_b0);
    SStack_b8 = S1Angle::Radians(0.0);
    S2Cap::S2Cap(__return_storage_ptr__,&local_a0,SStack_b8);
    for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
      SVar6 = GetVertex(this,local_bc);
      local_e8 = SVar6.coords_.c_;
      S2LatLng::ToPoint(&local_d8,(S2LatLng *)&local_e8);
      S2Cap::AddPoint(__return_storage_ptr__,&local_d8);
    }
    dVar4 = S2Cap::height(__return_storage_ptr__);
    dVar5 = S2Cap::height((S2Cap *)local_50);
    if (dVar4 < dVar5) {
      local_85 = 1;
    }
    if ((local_85 & 1) == 0) {
      S2Cap::~S2Cap(__return_storage_ptr__);
    }
    if (dVar4 < dVar5) goto LAB_00493c5c;
  }
  S2Cap::S2Cap(__return_storage_ptr__,(S2Cap *)local_50);
LAB_00493c5c:
  S2Cap::~S2Cap((S2Cap *)local_50);
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2LatLngRect::GetCapBound() const {
  // We consider two possible bounding caps, one whose axis passes
  // through the center of the lat-long rectangle and one whose axis
  // is the north or south pole.  We return the smaller of the two caps.

  if (is_empty()) return S2Cap::Empty();

  double pole_z, pole_angle;
  if (lat_.lo() + lat_.hi() < 0) {
    // South pole axis yields smaller cap.
    pole_z = -1;
    pole_angle = M_PI_2 + lat_.hi();
  } else {
    pole_z = 1;
    pole_angle = M_PI_2 - lat_.lo();
  }
  S2Cap pole_cap(S2Point(0, 0, pole_z), S1Angle::Radians(pole_angle));

  // For bounding rectangles that span 180 degrees or less in longitude, the
  // maximum cap size is achieved at one of the rectangle vertices.  For
  // rectangles that are larger than 180 degrees, we punt and always return a
  // bounding cap centered at one of the two poles.
  double lng_span = lng_.hi() - lng_.lo();
  if (remainder(lng_span, 2 * M_PI) >= 0 && lng_span < 2 * M_PI) {
    S2Cap mid_cap(GetCenter().ToPoint(), S1Angle::Radians(0));
    for (int k = 0; k < 4; ++k) {
      mid_cap.AddPoint(GetVertex(k).ToPoint());
    }
    if (mid_cap.height() < pole_cap.height())
      return mid_cap;
  }
  return pole_cap;
}